

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O0

void __thiscall UnitTest_parser_exp2::Run(UnitTest_parser_exp2 *this)

{
  size_type sVar1;
  pointer pSVar2;
  UnitTestBase *this_00;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *this_01;
  long lVar3;
  BinaryExpression *right;
  BinaryExpression *left;
  BinaryExpression *bin_exp;
  value_type *exp;
  ExpressionList *exp_list;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> root;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_fffffffffffffcf0;
  allocator *paVar4;
  string *in_stack_fffffffffffffcf8;
  long local_2f0;
  AcceptAST *in_stack_fffffffffffffd18;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_fffffffffffffd20;
  allocator *in_stack_fffffffffffffd28;
  UnitTestBase *in_stack_fffffffffffffd30;
  long local_2b8;
  long local_2a0;
  long local_280;
  long local_260;
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  UnitTestBase *local_190;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  long local_e8;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  long local_90;
  reference local_88;
  allocator local_79;
  string local_78 [40];
  ExpressionList *local_50;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"a = 1 + 2 + 3 * 4",&local_31);
  anon_unknown.dwarf_4b09::Parse(in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_50 = ASTFind<luna::ExpressionList,AcceptAST>
                       (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  sVar1 = std::
          vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
          ::size(&local_50->exp_list_);
  if (sVar1 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"\'exp_list->exp_list_.size() == 1\'",&local_79);
    UnitTestBase::Error(in_stack_fffffffffffffd30,(string *)in_stack_fffffffffffffd28);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  local_88 = std::
             vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
             ::operator[](&local_50->exp_list_,0);
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::get
                     (in_stack_fffffffffffffcf0);
  if (pSVar2 == (pointer)0x0) {
    local_260 = 0;
  }
  else {
    local_260 = __dynamic_cast(pSVar2,&luna::SyntaxTree::typeinfo,&luna::BinaryExpression::typeinfo,
                               0);
  }
  local_90 = local_260;
  if (local_260 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"\'bin_exp\'",&local_b1);
    UnitTestBase::Error(in_stack_fffffffffffffd30,(string *)in_stack_fffffffffffffd28);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  if (*(int *)(local_90 + 0x30) != 0x2b) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"\'bin_exp->op_token_.token_ == \'+\'\'",&local_d9);
    UnitTestBase::Error(in_stack_fffffffffffffd30,(string *)in_stack_fffffffffffffd28);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  }
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::get
                     (in_stack_fffffffffffffcf0);
  if (pSVar2 == (pointer)0x0) {
    local_280 = 0;
  }
  else {
    local_280 = __dynamic_cast(pSVar2,&luna::SyntaxTree::typeinfo,&luna::BinaryExpression::typeinfo,
                               0);
  }
  local_e8 = local_280;
  if (local_280 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"\'left\'",&local_109);
    UnitTestBase::Error(in_stack_fffffffffffffd30,(string *)in_stack_fffffffffffffd28);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  if (*(int *)(local_e8 + 0x30) != 0x2b) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"\'left->op_token_.token_ == \'+\'\'",&local_131);
    UnitTestBase::Error(in_stack_fffffffffffffd30,(string *)in_stack_fffffffffffffd28);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
  }
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::get
                     (in_stack_fffffffffffffcf0);
  if (pSVar2 == (pointer)0x0) {
    local_2a0 = 0;
  }
  else {
    local_2a0 = __dynamic_cast(pSVar2,&luna::SyntaxTree::typeinfo,&luna::Terminator::typeinfo,0);
  }
  if (local_2a0 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_158,"\'dynamic_cast<luna::Terminator *>(left->left_.get())\'",&local_159);
    UnitTestBase::Error(in_stack_fffffffffffffd30,(string *)in_stack_fffffffffffffd28);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
  }
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::get
                     (in_stack_fffffffffffffcf0);
  if (pSVar2 == (pointer)0x0) {
    local_2b8 = 0;
  }
  else {
    local_2b8 = __dynamic_cast(pSVar2,&luna::SyntaxTree::typeinfo,&luna::Terminator::typeinfo,0);
  }
  if (local_2b8 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_180,"\'dynamic_cast<luna::Terminator *>(left->right_.get())\'",&local_181);
    UnitTestBase::Error(in_stack_fffffffffffffd30,(string *)in_stack_fffffffffffffd28);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
  }
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::get
                     (in_stack_fffffffffffffcf0);
  if (pSVar2 == (pointer)0x0) {
    this_00 = (UnitTestBase *)0x0;
  }
  else {
    this_00 = (UnitTestBase *)
              __dynamic_cast(pSVar2,&luna::SyntaxTree::typeinfo,&luna::BinaryExpression::typeinfo,0)
    ;
  }
  local_190 = this_00;
  if (this_00 == (UnitTestBase *)0x0) {
    in_stack_fffffffffffffd28 = &local_1b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b0,"\'right\'",in_stack_fffffffffffffd28);
    UnitTestBase::Error(this_00,(string *)in_stack_fffffffffffffd28);
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  }
  if (*(int *)&(local_190->errors_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish != 0x2a) {
    paVar4 = &local_1d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"\'right->op_token_.token_ == \'*\'\'",paVar4);
    UnitTestBase::Error(this_00,(string *)in_stack_fffffffffffffd28);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  }
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::get
                     (in_stack_fffffffffffffcf0);
  if (pSVar2 == (pointer)0x0) {
    local_2f0 = 0;
  }
  else {
    local_2f0 = __dynamic_cast(pSVar2,&luna::SyntaxTree::typeinfo,&luna::Terminator::typeinfo,0);
  }
  if (local_2f0 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_200,"\'dynamic_cast<luna::Terminator *>(right->left_.get())\'",&local_201);
    UnitTestBase::Error(this_00,(string *)in_stack_fffffffffffffd28);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
  }
  this_01 = (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
            std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::get
                      (in_stack_fffffffffffffcf0);
  if (this_01 == (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(this_01,&luna::SyntaxTree::typeinfo,&luna::Terminator::typeinfo,0);
  }
  if (lVar3 == 0) {
    paVar4 = &local_229;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_228,"\'dynamic_cast<luna::Terminator *>(right->right_.get())\'",paVar4);
    UnitTestBase::Error(this_00,(string *)in_stack_fffffffffffffd28);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
  }
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(this_01);
  return;
}

Assistant:

TEST_CASE(parser_exp2)
{
    auto root = Parse("a = 1 + 2 + 3 * 4");
    auto exp_list = ASTFind<luna::ExpressionList>(root, AcceptAST());
    EXPECT_TRUE(exp_list->exp_list_.size() == 1);
    auto &exp = exp_list->exp_list_[0];
    auto bin_exp = dynamic_cast<luna::BinaryExpression *>(exp.get());
    EXPECT_TRUE(bin_exp);
    EXPECT_TRUE(bin_exp->op_token_.token_ == '+');

    // 1 + 2
    auto left = dynamic_cast<luna::BinaryExpression *>(bin_exp->left_.get());
    EXPECT_TRUE(left);
    EXPECT_TRUE(left->op_token_.token_ == '+');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(left->left_.get()));
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(left->right_.get()));

    // 3 * 4
    auto right = dynamic_cast<luna::BinaryExpression *>(bin_exp->right_.get());
    EXPECT_TRUE(right);
    EXPECT_TRUE(right->op_token_.token_ == '*');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(right->left_.get()));
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(right->right_.get()));
}